

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O3

void anon_unknown.dwarf_daeed7::ProcessMetadata
               (uint64_t relDefinesByPropertiesID,ConversionData *conv,Metadata *properties)

{
  DB *pDVar1;
  _Base_ptr p_Var2;
  Object *pOVar3;
  long lVar4;
  IfcPropertySetDefinition *pIVar5;
  _Base_ptr p_Var6;
  uint in_R8D;
  bool bVar7;
  long *local_40 [2];
  long local_30 [2];
  
  p_Var6 = (conv->db->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &(conv->db->objects)._M_t._M_impl.super__Rb_tree_header._M_header;
  do {
    if (*(ulong *)(p_Var6 + 1) >= relDefinesByPropertiesID) {
      p_Var2 = p_Var6;
    }
    p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < relDefinesByPropertiesID];
  } while (p_Var6 != (_Base_ptr)0x0);
  pOVar3 = Assimp::STEP::LazyObject::operator*((LazyObject *)p_Var2[1]._M_parent);
  lVar4 = __dynamic_cast(pOVar3,&Assimp::STEP::Object::typeinfo,
                         &Assimp::IFC::Schema_2x3::IfcRelDefinesByProperties::typeinfo,
                         0xffffffffffffffff);
  if (lVar4 != 0) {
    pDVar1 = conv->db;
    pIVar5 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>
                       (*(LazyObject **)(lVar4 + 0xd0));
    p_Var6 = (pDVar1->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var2 = &(pDVar1->objects)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      bVar7 = *(ulong *)(p_Var6 + 1) <
              *(ulong *)((pIVar5->super_IfcPropertyDefinition).super_IfcRoot.
                         super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                         _vptr_ObjectHelper[-3] +
                        (long)&(pIVar5->super_IfcPropertyDefinition).super_IfcRoot.
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                               aux_is_derived.super__Base_bitset<1UL>);
      if (!bVar7) {
        p_Var2 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[bVar7];
    } while (p_Var6 != (_Base_ptr)0x0);
    pOVar3 = Assimp::STEP::LazyObject::operator*((LazyObject *)p_Var2[1]._M_parent);
    lVar4 = __dynamic_cast(pOVar3,&Assimp::STEP::Object::typeinfo,
                           &Assimp::IFC::Schema_2x3::IfcPropertySet::typeinfo);
    if (lVar4 != 0) {
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"");
      ProcessMetadata((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_1UL,_0UL> *)
                      (lVar4 + 0xb8),(ConversionData *)properties,(Metadata *)local_40,(string *)0x0
                      ,in_R8D);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
    }
  }
  return;
}

Assistant:

void ProcessMetadata(uint64_t relDefinesByPropertiesID, ConversionData& conv, Metadata& properties)
{
    if (const Schema_2x3::IfcRelDefinesByProperties* const pset = conv.db.GetObject(relDefinesByPropertiesID)->ToPtr<Schema_2x3::IfcRelDefinesByProperties>()) {
        if (const Schema_2x3::IfcPropertySet* const set = conv.db.GetObject(pset->RelatingPropertyDefinition->GetID())->ToPtr<Schema_2x3::IfcPropertySet>()) {
            ProcessMetadata(set->HasProperties, conv, properties);
        }
    }
}